

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O3

long __thiscall
Bob::ObliviousTranslateSingleAddress
          (Bob *this,long addr,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  Message MVar4;
  Message local_70;
  double local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((Perm->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (Perm->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
  }
  else {
    local_60 = 0.0;
    lVar1 = 0;
    uVar2 = 0;
    local_58 = addr;
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"==","");
      local_70.scalar2 =
           *(long *)((long)&((Perm->
                             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->first + lVar1);
      local_70.scalar1 = local_58;
      Client::Send(this->cli,&local_70);
      MVar4 = Client::Receive(this->cli);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      dVar3 = ObliviousMultiplication
                        (this,MVar4.scalar1,
                         *(long *)((long)&((Perm->
                                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->second +
                                  lVar1));
      local_60 = local_60 + dVar3;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)(Perm->
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(Perm->
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
    lVar1 = (long)local_60;
  }
  return lVar1;
}

Assistant:

long Bob::ObliviousTranslateSingleAddress(long addr, std::vector<std::pair<long,long>> Perm)
{
   double result = 0;
   long beta = 0;
   for(int i=0; i < Perm.size(); i++)
   {
       beta = ObliviousComparison("==", addr, Perm[i].first);
       result += ObliviousMultiplication(beta, Perm[i].second);
   } 
   return result;
}